

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O3

double r8_gamma_log(double x)

{
  long lVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  
  dVar2 = 1e+30;
  if ((0.0 < x) && (x <= 4.08e+36)) {
    dVar2 = r8_epsilon();
    if (x <= dVar2) {
      dVar2 = log(x);
      dVar2 = -dVar2;
    }
    else if (x <= 1.5) {
      if (0.6796875 <= x) {
        dVar2 = x + -0.5 + -0.5;
        dVar3 = 0.0;
      }
      else {
        dVar3 = log(x);
        dVar3 = -dVar3;
        dVar2 = x;
      }
      if ((x <= 0.5) || (0.6796875 <= x)) {
        dVar4 = 1.0;
        dVar5 = 0.0;
        lVar1 = 0;
        do {
          dVar5 = dVar5 * dVar2 + *(double *)((long)&DAT_0021e980 + lVar1);
          dVar4 = dVar4 * dVar2 + *(double *)((long)&DAT_0021ea40 + lVar1);
          lVar1 = lVar1 + 8;
        } while (lVar1 != 0x40);
        dVar2 = ((dVar5 / dVar4) * dVar2 + -0.5772156649015329) * dVar2;
      }
      else {
        dVar2 = x + -0.5 + -0.5;
        dVar4 = 1.0;
        dVar5 = 0.0;
        lVar1 = 0;
        do {
          dVar5 = dVar5 * dVar2 + *(double *)((long)&DAT_0021e9c0 + lVar1);
          dVar4 = dVar4 * dVar2 + *(double *)((long)&DAT_0021ea80 + lVar1);
          lVar1 = lVar1 + 8;
        } while (lVar1 != 0x40);
        dVar2 = ((dVar5 / dVar4) * dVar2 + 0.42278433509846713) * dVar2;
      }
      dVar2 = dVar2 + dVar3;
    }
    else if (x <= 4.0) {
      dVar2 = x + -2.0;
      dVar5 = 1.0;
      dVar3 = 0.0;
      lVar1 = 0;
      do {
        dVar3 = dVar3 * dVar2 + *(double *)((long)&DAT_0021e9c0 + lVar1);
        dVar5 = dVar5 * dVar2 + *(double *)((long)&DAT_0021ea80 + lVar1);
        lVar1 = lVar1 + 8;
      } while (lVar1 != 0x40);
      dVar2 = ((dVar3 / dVar5) * dVar2 + 0.42278433509846713) * dVar2;
    }
    else if (x <= 12.0) {
      dVar5 = x + -4.0;
      dVar3 = -1.0;
      dVar2 = 0.0;
      lVar1 = 0;
      do {
        dVar2 = dVar2 * dVar5 + *(double *)((long)&DAT_0021ea00 + lVar1);
        dVar3 = dVar3 * dVar5 + *(double *)((long)&DAT_0021eac0 + lVar1);
        lVar1 = lVar1 + 8;
      } while (lVar1 != 0x40);
      dVar2 = dVar5 * (dVar2 / dVar3) + 1.791759469228055;
    }
    else {
      dVar2 = 0.0;
      if (x <= 1420000000.0) {
        dVar2 = 0.0057083835261;
        lVar1 = 0;
        do {
          dVar2 = dVar2 / (x * x) + *(double *)((long)&DAT_0021e940 + lVar1);
          lVar1 = lVar1 + 8;
        } while (lVar1 != 0x30);
      }
      dVar3 = log(x);
      dVar2 = (dVar3 + -1.0) * x + dVar3 * -0.5 + dVar2 / x + 0.9189385332046728;
    }
  }
  return dVar2;
}

Assistant:

double r8_gamma_log ( double x )

//****************************************************************************80
//
//  Purpose:
//
//    R8_GAMMA_LOG calculates the logarithm of GAMMA ( X ) for positive X.
//
//  Discussion:
//
//    The program uses rational functions that theoretically approximate
//    LOG(GAMMA(X)) to at least 18 significant decimal digits.  The
//    approximation for 12 < X is from Hart et al, while approximations
//    for X < 12.0 are similar to those in Cody and Hillstrom, but are
//    unpublished.
//
//    The accuracy achieved depends on the arithmetic system, the compiler,
//    intrinsic functions, and proper selection of the machine-dependent
//    constants.
//
//  Modified:
//
//    12 May 2003
//
//  Author:
//
//    Original FORTRAN77 version by William Cody, Laura Stoltz.
//    C++ version by John Burkardt.
//
//  Reference:
//
//    William Cody, Kenneth Hillstrom,
//    Chebyshev Approximations for the Natural Logarithm of the Gamma Function,
//    Mathematics of Computation,
//    Volume 21, 1967, pages 198-203.
//
//    Kenneth Hillstrom,
//    ANL/AMD Program ANLC366S, DGAMMA/DLGAMA,
//    May 1969.
//
//    Hart, Ward Cheney, Charles Lawson, Maehly,
//    Charles Mesztenyi, John Rice, Thacher, Witzgall,
//    Computer Approximations,
//    Wiley and sons, New York, 1968.
//
//  Parameters:
//
//    Input, double X, the argument of the Gamma function.  X must be positive.
//
//    Output, double R8_GAMMA_LOG, the logarithm of the Gamma function of X.
//    If X <= 0.0, or if overflow would occur, the program returns the
//    value XINF, the largest representable floating point number.
//
//  Machine-dependent constants:
//
//  BETA   - radix for the floating-point representation.
//
//  MAXEXP - the smallest positive power of BETA that overflows.
//
//  XBIG   - largest argument for which LN(GAMMA(X)) is representable
//           in the machine, i.e., the solution to the equation
//             LN(GAMMA(XBIG)) = BETA^MAXEXP.
//
//  FRTBIG - Rough estimate of the fourth root of XBIG
//
{
  double c[7] = {
    -1.910444077728E-03,
     8.4171387781295E-04,
    -5.952379913043012E-04,
     7.93650793500350248E-04,
    -2.777777777777681622553E-03,
     8.333333333333333331554247E-02,
     5.7083835261E-03 };
  double corr;
  double d1 = - 5.772156649015328605195174E-01;
  double d2 =   4.227843350984671393993777E-01;
  double d4 =   1.791759469228055000094023;
  double frtbig = 1.42E+09;
  int i;
  double p1[8] = {
    4.945235359296727046734888,
    2.018112620856775083915565E+02,
    2.290838373831346393026739E+03,
    1.131967205903380828685045E+04,
    2.855724635671635335736389E+04,
    3.848496228443793359990269E+04,
    2.637748787624195437963534E+04,
    7.225813979700288197698961E+03 };
  double p2[8] = {
    4.974607845568932035012064,
    5.424138599891070494101986E+02,
    1.550693864978364947665077E+04,
    1.847932904445632425417223E+05,
    1.088204769468828767498470E+06,
    3.338152967987029735917223E+06,
    5.106661678927352456275255E+06,
    3.074109054850539556250927E+06 };
  double p4[8] = {
    1.474502166059939948905062E+04,
    2.426813369486704502836312E+06,
    1.214755574045093227939592E+08,
    2.663432449630976949898078E+09,
    2.940378956634553899906876E+010,
    1.702665737765398868392998E+011,
    4.926125793377430887588120E+011,
    5.606251856223951465078242E+011 };
  double pnt68 = 0.6796875;
  double q1[8] = {
    6.748212550303777196073036E+01,
    1.113332393857199323513008E+03,
    7.738757056935398733233834E+03,
    2.763987074403340708898585E+04,
    5.499310206226157329794414E+04,
    6.161122180066002127833352E+04,
    3.635127591501940507276287E+04,
    8.785536302431013170870835E+03 };
  double q2[8] = {
    1.830328399370592604055942E+02,
    7.765049321445005871323047E+03,
    1.331903827966074194402448E+05,
    1.136705821321969608938755E+06,
    5.267964117437946917577538E+06,
    1.346701454311101692290052E+07,
    1.782736530353274213975932E+07,
    9.533095591844353613395747E+06 };
  double q4[8] = {
    2.690530175870899333379843E+03,
    6.393885654300092398984238E+05,
    4.135599930241388052042842E+07,
    1.120872109616147941376570E+09,
    1.488613728678813811542398E+010,
    1.016803586272438228077304E+011,
    3.417476345507377132798597E+011,
    4.463158187419713286462081E+011 };
  const double r8_huge = 1.0E+30;
  double res;
  double sqrtpi = 0.9189385332046727417803297;
  double xbig = 4.08E+36;
  double xden;
  double xm1;
  double xm2;
  double xm4;
  double xnum;
  double xsq;
//
//  Return immediately if the argument is out of range.
//
  if ( x <= 0.0 || xbig < x )
  {
    return r8_huge;
  }

  if ( x <= r8_epsilon ( ) )
  {
    res = - log ( x );
  }
  else if ( x <= 1.5 )
  {
    if ( x < pnt68 )
    {
      corr = - log ( x );
      xm1 = x;
    }
    else
    {
      corr = 0.0;
      xm1 = ( x - 0.5 ) - 0.5;
    }

    if ( x <= 0.5 || pnt68 <= x )
    {
      xden = 1.0;
      xnum = 0.0;

      for ( i = 0; i < 8; i++ )
      {
        xnum = xnum * xm1 + p1[i];
        xden = xden * xm1 + q1[i];
      }

      res = corr + ( xm1 * ( d1 + xm1 * ( xnum / xden ) ) );
    }
    else
    {
      xm2 = ( x - 0.5 ) - 0.5;
      xden = 1.0;
      xnum = 0.0;
      for ( i = 0; i < 8; i++ )
      {
        xnum = xnum * xm2 + p2[i];
        xden = xden * xm2 + q2[i];
      }

      res = corr + xm2 * ( d2 + xm2 * ( xnum / xden ) );

    }
  }
  else if ( x <= 4.0 )
  {
    xm2 = x - 2.0;
    xden = 1.0;
    xnum = 0.0;
    for ( i = 0; i < 8; i++ )
    {
      xnum = xnum * xm2 + p2[i];
      xden = xden * xm2 + q2[i];
    }

    res = xm2 * ( d2 + xm2 * ( xnum / xden ) );
  }
  else if ( x <= 12.0 )
  {
    xm4 = x - 4.0;
    xden = - 1.0;
    xnum = 0.0;
    for ( i = 0; i < 8; i++ )
    {
      xnum = xnum * xm4 + p4[i];
      xden = xden * xm4 + q4[i];
    }

    res = d4 + xm4 * ( xnum / xden );
  }
  else
  {
    res = 0.0;

    if ( x <= frtbig )
    {

      res = c[6];
      xsq = x * x;

      for ( i = 0; i < 6; i++ )
      {
        res = res / xsq + c[i];
      }

    }

    res = res / x;
    corr = log ( x );
    res = res + sqrtpi - 0.5 * corr;
    res = res + x * ( corr - 1.0 );

  }

  return res;
}